

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O0

void aom_comp_mask_pred_ssse3
               (uint8_t *comp_pred,uint8_t *pred,int width,int height,uint8_t *ref,int ref_stride,
               uint8_t *mask,int mask_stride,int invert_mask)

{
  int in_ECX;
  int in_EDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  uint8_t *unaff_retaddr;
  int x;
  int i;
  int stride1;
  int stride0;
  uint8_t *src1;
  uint8_t *src0;
  undefined4 in_stack_00000050;
  uint8_t *in_stack_00000300;
  int in_stack_00000308;
  int local_48;
  int local_44;
  int iVar1;
  
  local_44 = 0;
  if (in_EDX == 8) {
    comp_mask_pred_8_ssse3
              ((uint8_t *)CONCAT44(width,height),ref._4_4_,
               (uint8_t *)CONCAT44(ref_stride,in_stack_00000050),src0._4_4_,src1,stride0,
               in_stack_00000300,in_stack_00000308);
  }
  else if (in_EDX == 0x10) {
    iVar1 = 0x10;
    do {
      comp_mask_pred_16_ssse3(unaff_retaddr,in_RDI,in_RSI,(uint8_t *)CONCAT44(iVar1,in_ECX));
      comp_mask_pred_16_ssse3(unaff_retaddr,in_RDI,in_RSI,(uint8_t *)CONCAT44(iVar1,in_ECX));
      in_RDI = in_RDI + (iVar1 << 1);
      local_44 = local_44 + 2;
    } while (local_44 < in_ECX);
  }
  else {
    do {
      for (local_48 = 0; local_48 < in_EDX; local_48 = local_48 + 0x20) {
        comp_mask_pred_16_ssse3(unaff_retaddr,in_RDI,in_RSI,(uint8_t *)CONCAT44(in_EDX,in_ECX));
        comp_mask_pred_16_ssse3(unaff_retaddr,in_RDI,in_RSI,(uint8_t *)CONCAT44(in_EDX,in_ECX));
        in_RDI = in_RDI + 0x20;
      }
      local_44 = local_44 + 1;
    } while (local_44 < in_ECX);
  }
  return;
}

Assistant:

void aom_comp_mask_pred_ssse3(uint8_t *comp_pred, const uint8_t *pred,
                              int width, int height, const uint8_t *ref,
                              int ref_stride, const uint8_t *mask,
                              int mask_stride, int invert_mask) {
  const uint8_t *src0 = invert_mask ? pred : ref;
  const uint8_t *src1 = invert_mask ? ref : pred;
  const int stride0 = invert_mask ? width : ref_stride;
  const int stride1 = invert_mask ? ref_stride : width;
  assert(height % 2 == 0);
  int i = 0;
  if (width == 8) {
    comp_mask_pred_8_ssse3(comp_pred, height, src0, stride0, src1, stride1,
                           mask, mask_stride);
  } else if (width == 16) {
    do {
      comp_mask_pred_16_ssse3(src0, src1, mask, comp_pred);
      comp_mask_pred_16_ssse3(src0 + stride0, src1 + stride1,
                              mask + mask_stride, comp_pred + width);
      comp_pred += (width << 1);
      src0 += (stride0 << 1);
      src1 += (stride1 << 1);
      mask += (mask_stride << 1);
      i += 2;
    } while (i < height);
  } else {
    do {
      for (int x = 0; x < width; x += 32) {
        comp_mask_pred_16_ssse3(src0 + x, src1 + x, mask + x, comp_pred);
        comp_mask_pred_16_ssse3(src0 + x + 16, src1 + x + 16, mask + x + 16,
                                comp_pred + 16);
        comp_pred += 32;
      }
      src0 += (stride0);
      src1 += (stride1);
      mask += (mask_stride);
      i += 1;
    } while (i < height);
  }
}